

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O0

pint p_test_case_psocket_bad_input_test(void)

{
  int iVar1;
  pint pVar2;
  long lVar3;
  PError *local_10;
  PError *error;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  local_10 = (PError *)0x0;
  lVar3 = p_socket_new_from_fd(0xffffffff,&local_10);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x281);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x282);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_new(2,0xffffffff,6,0);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x288);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_socket_new(0xffffffff,3,6,0);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x28e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_socket_new(0,0,0xffffffff,&local_10);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x293);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_socket_new_from_fd(1,0);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x294);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x295);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_get_fd(0);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x298);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_family(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x299);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_type(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_protocol(0);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_keepalive(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_blocking(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_timeout(0);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_listen_backlog(0);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x29f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(0,1);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(0,2);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a1);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_socket_get_local_address(0,&local_10);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_get_remote_address(0,&local_10);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2a8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_is_connected(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2ab);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2ac);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_check_connect_result(0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2ae);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2af);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  p_socket_set_keepalive(0,0);
  p_socket_set_blocking(0,0);
  p_socket_set_timeout(0,0);
  p_socket_set_listen_backlog(0,0);
  iVar1 = p_socket_bind(0,0,0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2b7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2b8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_connect(0,0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,699);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,700);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_listen(0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2bf);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2c0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_accept(0,&local_10);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2c3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2c4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_receive(0,0,0,&local_10);
  if (lVar3 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2c7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2c8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_receive_from(0,0,0,0,&local_10);
  if (lVar3 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2cb);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2cc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_send(0,0,0,&local_10);
  if (lVar3 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2cf);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2d0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  lVar3 = p_socket_send_to(0,0,0,0,&local_10);
  if (lVar3 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2d3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2d4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_close(0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2d7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2d8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_shutdown(0,0,0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2db);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2dc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_set_buffer_size(0,1,0,&local_10);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2df);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2e0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  iVar1 = p_socket_set_buffer_size(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2e3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_10 == (PError *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2e4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  clean_error(&local_10);
  p_socket_free(0);
  p_libsys_shutdown();
  pVar2 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar2 = 0;
  }
  return pVar2;
}

Assistant:

P_TEST_CASE_BEGIN (psocket_bad_input_test)
{
	p_libsys_init ();

	PError *error = NULL;

	P_TEST_CHECK (p_socket_new_from_fd (-1, &error) == NULL);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_new (P_SOCKET_FAMILY_INET,
				   (PSocketType) -1,
				   P_SOCKET_PROTOCOL_TCP,
				   NULL) == NULL);
	/* Syllable doesn't validate socket family */
#ifndef P_OS_SYLLABLE
	P_TEST_CHECK (p_socket_new ((PSocketFamily) -1,
				   P_SOCKET_TYPE_SEQPACKET,
				   P_SOCKET_PROTOCOL_TCP,
				   NULL) == NULL);
#endif
	P_TEST_CHECK (p_socket_new (P_SOCKET_FAMILY_UNKNOWN,
				   P_SOCKET_TYPE_UNKNOWN,
				   P_SOCKET_PROTOCOL_UNKNOWN,
				   &error) == NULL);
	P_TEST_CHECK (p_socket_new_from_fd (1, NULL) == NULL);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_get_fd (NULL) == -1);
	P_TEST_CHECK (p_socket_get_family (NULL) == P_SOCKET_FAMILY_UNKNOWN);
	P_TEST_CHECK (p_socket_get_type (NULL) == P_SOCKET_TYPE_UNKNOWN);
	P_TEST_CHECK (p_socket_get_protocol (NULL) == P_SOCKET_PROTOCOL_UNKNOWN);
	P_TEST_CHECK (p_socket_get_keepalive (NULL) == FALSE);
	P_TEST_CHECK (p_socket_get_blocking (NULL) == FALSE);
	P_TEST_CHECK (p_socket_get_timeout (NULL) == -1);
	P_TEST_CHECK (p_socket_get_listen_backlog (NULL) == -1);
	P_TEST_CHECK (p_socket_io_condition_wait (NULL, P_SOCKET_IO_CONDITION_POLLIN, NULL) == FALSE);
	P_TEST_CHECK (p_socket_io_condition_wait (NULL, P_SOCKET_IO_CONDITION_POLLOUT, NULL) == FALSE);

	P_TEST_CHECK (p_socket_get_local_address (NULL, &error) == NULL);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_get_remote_address (NULL, &error) == NULL);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_is_connected (NULL) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (NULL) == TRUE);

	P_TEST_CHECK (p_socket_check_connect_result (NULL, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	p_socket_set_keepalive (NULL, FALSE);
	p_socket_set_blocking (NULL, FALSE);
	p_socket_set_timeout (NULL, 0);
	p_socket_set_listen_backlog (NULL, 0);

	P_TEST_CHECK (p_socket_bind (NULL, NULL, FALSE, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_connect (NULL, NULL, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_listen (NULL, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_accept (NULL, &error) == NULL);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_receive (NULL, NULL, 0, &error) == -1);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_receive_from (NULL, NULL, NULL, 0, &error) == -1);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_send (NULL, NULL, 0, &error) == -1);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_send_to (NULL, NULL, NULL, 0, &error) == -1);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_close (NULL, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_shutdown (NULL, FALSE, FALSE, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_set_buffer_size (NULL, P_SOCKET_DIRECTION_RCV, 0, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	P_TEST_CHECK (p_socket_set_buffer_size (NULL, P_SOCKET_DIRECTION_SND, 0, &error) == FALSE);
	P_TEST_CHECK (error != NULL);
	clean_error (&error);

	p_socket_free (NULL);

	p_libsys_shutdown ();
}